

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

char __thiscall Fl_Preferences::get(Fl_Preferences *this,char *key,float *value,float defaultValue)

{
  char *__nptr;
  double dVar1;
  float local_34;
  char *v;
  float defaultValue_local;
  float *value_local;
  char *key_local;
  Fl_Preferences *this_local;
  
  __nptr = Node::get(this->node,key);
  local_34 = defaultValue;
  if (__nptr != (char *)0x0) {
    dVar1 = atof(__nptr);
    local_34 = (float)dVar1;
  }
  *value = local_34;
  return __nptr != (char *)0x0;
}

Assistant:

char Fl_Preferences::get( const char *key, float &value, float defaultValue ) {
  const char *v = node->get( key );
  value = v ? (float)atof( v ) : defaultValue;
  return ( v != 0 );
}